

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O3

int metacall_serial_impl_deserialize_int(value *v,char *src,size_t length)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  value pvVar6;
  
  ppuVar4 = __ctype_b_loc();
  cVar1 = *src;
  if (((((*ppuVar4)[cVar1] >> 0xb & 1) != 0) || (cVar1 == '-')) || (uVar2 = 1, cVar1 == '+')) {
    if (1 < length) {
      sVar5 = 1;
      do {
        if ((*(byte *)((long)*ppuVar4 + (long)src[sVar5] * 2 + 1) & 8) == 0) {
          return 1;
        }
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    iVar3 = atoi(src);
    pvVar6 = (value)value_create_int(iVar3);
    *v = pvVar6;
    uVar2 = (uint)(pvVar6 == (value)0x0);
  }
  return uVar2;
}

Assistant:

int metacall_serial_impl_deserialize_int(value *v, const char *src, size_t length)
{
	size_t iterator;

	if (isdigit((int)src[0]) == 0 && src[0] != '-' && src[0] != '+')
	{
		return 1;
	}

	for (iterator = 1; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0)
		{
			return 1;
		}
	}

	*v = value_create_int(atoi(src));

	return (*v == NULL);
}